

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O3

void __thiscall
CoreML::Specification::PaddingLayerParams::CheckTypeAndMergeFrom
          (PaddingLayerParams *this,MessageLite *from)

{
  int iVar1;
  ulong uVar2;
  LogMessage *other;
  BorderAmounts *this_00;
  PaddingLayerParams_PaddingReflection *this_01;
  PaddingLayerParams_PaddingReplication *this_02;
  PaddingLayerParams_PaddingConstant *this_03;
  undefined1 *puVar3;
  Arena *pAVar4;
  LogFinisher LStack_51;
  LogMessage LStack_50;
  
  if (from->_vptr_MessageLite != (_func_int **)&PTR__PaddingLayerParams_00488bd0) {
    __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/casts.h"
                  ,0x5e,
                  "To google::protobuf::internal::down_cast(From *) [To = const CoreML::Specification::PaddingLayerParams *, From = const google::protobuf::MessageLite]"
                 );
  }
  if ((PaddingLayerParams *)from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&LStack_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x6e69);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&LStack_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&LStack_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&LStack_50);
  }
  puVar3 = (undefined1 *)from[1]._vptr_MessageLite;
  if ((BorderAmounts *)puVar3 != (BorderAmounts *)0x0 &&
      from != (MessageLite *)_PaddingLayerParams_default_instance_) {
    this_00 = this->paddingamounts_;
    if (this_00 == (BorderAmounts *)0x0) {
      uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      this_00 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::BorderAmounts>
                          (pAVar4);
      this->paddingamounts_ = this_00;
      puVar3 = (undefined1 *)from[1]._vptr_MessageLite;
    }
    if ((BorderAmounts *)puVar3 == (BorderAmounts *)0x0) {
      puVar3 = _BorderAmounts_default_instance_;
    }
    BorderAmounts::MergeFrom(this_00,(BorderAmounts *)puVar3);
  }
  iVar1 = *(int *)((long)&from[2]._vptr_MessageLite + 4);
  if (iVar1 != 3) {
    if (iVar1 != 2) {
      if (iVar1 != 1) goto LAB_0024a7f5;
      if (this->_oneof_case_[0] == 1) {
        this_03 = (this->PaddingType_).constant_;
LAB_0024a7c7:
        puVar3 = (undefined1 *)from[1]._internal_metadata_.ptr_;
      }
      else {
        clear_PaddingType(this);
        this->_oneof_case_[0] = 1;
        uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
        pAVar4 = (Arena *)(uVar2 & 0xfffffffffffffffc);
        if ((uVar2 & 1) != 0) {
          pAVar4 = *(Arena **)pAVar4;
        }
        this_03 = google::protobuf::Arena::
                  CreateMaybeMessage<CoreML::Specification::PaddingLayerParams_PaddingConstant>
                            (pAVar4);
        (this->PaddingType_).constant_ = this_03;
        if (*(int *)((long)&from[2]._vptr_MessageLite + 4) == 1) goto LAB_0024a7c7;
        puVar3 = _PaddingLayerParams_PaddingConstant_default_instance_;
      }
      PaddingLayerParams_PaddingConstant::MergeFrom
                (this_03,(PaddingLayerParams_PaddingConstant *)puVar3);
      goto LAB_0024a7f5;
    }
    if (this->_oneof_case_[0] == 2) {
      this_01 = (this->PaddingType_).reflection_;
LAB_0024a751:
      puVar3 = (undefined1 *)from[1]._internal_metadata_.ptr_;
    }
    else {
      clear_PaddingType(this);
      this->_oneof_case_[0] = 2;
      uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      this_01 = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::PaddingLayerParams_PaddingReflection>
                          (pAVar4);
      (this->PaddingType_).reflection_ = this_01;
      if (*(int *)((long)&from[2]._vptr_MessageLite + 4) == 2) goto LAB_0024a751;
      puVar3 = _PaddingLayerParams_PaddingReflection_default_instance_;
    }
    PaddingLayerParams_PaddingReflection::MergeFrom
              (this_01,(PaddingLayerParams_PaddingReflection *)puVar3);
    goto LAB_0024a7f5;
  }
  if (this->_oneof_case_[0] == 3) {
    this_02 = (this->PaddingType_).replication_;
LAB_0024a78c:
    puVar3 = (undefined1 *)from[1]._internal_metadata_.ptr_;
  }
  else {
    clear_PaddingType(this);
    this->_oneof_case_[0] = 3;
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar4 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar4 = *(Arena **)pAVar4;
    }
    this_02 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::PaddingLayerParams_PaddingReplication>
                        (pAVar4);
    (this->PaddingType_).replication_ = this_02;
    if (*(int *)((long)&from[2]._vptr_MessageLite + 4) == 3) goto LAB_0024a78c;
    puVar3 = _PaddingLayerParams_PaddingReplication_default_instance_;
  }
  PaddingLayerParams_PaddingReplication::MergeFrom
            (this_02,(PaddingLayerParams_PaddingReplication *)puVar3);
LAB_0024a7f5:
  uVar2 = (from->_internal_metadata_).ptr_;
  if ((uVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar2 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

inline To down_cast(From* f) {                   // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  if (false) {
    implicit_cast<From*, To>(0);
  }

#if !defined(NDEBUG) && PROTOBUF_RTTI
  assert(f == nullptr || dynamic_cast<To>(f) != nullptr);  // RTTI: debug mode only!
#endif
  return static_cast<To>(f);
}